

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O1

UChar32 utf8_nextCharSafeBody_63(uint8_t *s,int32_t *pi,int32_t length,UChar32 c,UBool strict)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  uVar6 = *pi;
  if (0xf4 < c || uVar6 == length) goto LAB_001903bf;
  lVar8 = (long)(int)uVar6;
  uVar7 = uVar6;
  if (c < 0xf0) {
    if (c < 0xe0) {
      if ((0xc1 < c) && (bVar3 = s[lVar8], (byte)(bVar3 ^ 0x80) < 0x40)) {
        *pi = uVar6 + 1;
        return c * 0x40 + (bVar3 ^ 0x80) + -0x3000;
      }
      goto LAB_001903bf;
    }
    uVar5 = c & 0xf;
    bVar3 = s[lVar8];
    uVar4 = (uint)bVar3;
    if (strict == -2) {
      bVar3 = bVar3 + 0x80;
      uVar4 = (uint)bVar3;
      bVar2 = true;
      if ((bVar3 < 0x40) && ((uVar5 != 0 || (0x1f < bVar3)))) {
        uVar10 = lVar8 + 1;
        if (((int)uVar10 != length) && (bVar1 = s[uVar10], (byte)(bVar1 ^ 0x80) < 0x40)) {
          *pi = uVar6 + 2;
          uVar4 = uVar5 << 0xc | bVar1 ^ 0x80 | (uint)bVar3 << 6;
          bVar2 = false;
        }
      }
      else {
        uVar10 = (ulong)uVar6;
      }
      uVar7 = (uint)uVar10;
    }
    else {
      bVar2 = true;
      if (((byte)" 000000000000\x1000"[uVar5] >> (bVar3 >> 5) & 1) != 0) {
        lVar9 = lVar8 + 1;
        if (((int)lVar9 == length) || (0x3f < (byte)(s[lVar9] ^ 0x80))) goto LAB_001903b7;
        uVar7 = uVar6 + 2;
        uVar4 = (bVar3 & 0x3f) << 6 | uVar5 << 0xc | s[lVar9] ^ 0x80;
        if ((strict < '\x01') || ((uVar4 < 0xfdd0 || ((~uVar4 & 0xfffe) != 0 && 0xfdef < uVar4))))
        goto LAB_001903af;
      }
    }
  }
  else {
    uVar4 = (uint)(byte)""[s[lVar8] >> 4];
    bVar2 = true;
    if (((byte)""[s[lVar8] >> 4] >> (c & 7U) & 1) != 0) {
      uVar7 = (uint)(lVar8 + 1);
      if ((uVar7 != length) && (uVar4 = s[lVar8 + 1] ^ 0x80, (byte)uVar4 < 0x40)) {
        lVar9 = lVar8 + 2;
        if (((int)lVar9 == length) || (0x3f < (byte)(s[lVar9] ^ 0x80))) {
LAB_001903b7:
          bVar2 = true;
          uVar7 = (uint)lVar9;
        }
        else {
          uVar7 = uVar6 + 3;
          uVar6 = (s[lVar8] & 0x3f) << 0xc | (c & 7U) << 0x12;
          uVar4 = uVar4 << 6 | s[lVar9] ^ 0x80 | uVar6;
          if (((strict < '\x01') || (uVar4 < 0xfdd0)) ||
             ((0xfdef < uVar4 && (((~uVar4 & 0xfffe) != 0 || (0x10ffff < uVar6)))))) {
LAB_001903af:
            *pi = uVar7;
            bVar2 = false;
          }
        }
      }
    }
  }
  uVar6 = uVar7;
  if (!bVar2) {
    return uVar4;
  }
LAB_001903bf:
  if (strict < '\0') {
    uVar7 = -(uint)(strict != -3) | 0xfffd;
  }
  else {
    uVar7 = utf8_errorValue[(long)(int)uVar6 - (long)*pi];
  }
  *pi = uVar6;
  return uVar7;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utf8_nextCharSafeBody(const uint8_t *s, int32_t *pi, int32_t length, UChar32 c, UBool strict) {
    // *pi is one after byte c.
    int32_t i=*pi;
    // length can be negative for NUL-terminated strings: Read and validate one byte at a time.
    if(i==length || c>0xf4) {
        // end of string, or not a lead byte
    } else if(c>=0xf0) {
        // Test for 4-byte sequences first because
        // U8_NEXT() handles shorter valid sequences inline.
        uint8_t t1=s[i], t2, t3;
        c&=7;
        if(U8_IS_VALID_LEAD4_AND_T1(c, t1) &&
                ++i!=length && (t2=s[i]-0x80)<=0x3f &&
                ++i!=length && (t3=s[i]-0x80)<=0x3f) {
            ++i;
            c=(c<<18)|((t1&0x3f)<<12)|(t2<<6)|t3;
            // strict: forbid non-characters like U+fffe
            if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                *pi=i;
                return c;
            }
        }
    } else if(c>=0xe0) {
        c&=0xf;
        if(strict!=-2) {
            uint8_t t1=s[i], t2;
            if(U8_IS_VALID_LEAD3_AND_T1(c, t1) &&
                    ++i!=length && (t2=s[i]-0x80)<=0x3f) {
                ++i;
                c=(c<<12)|((t1&0x3f)<<6)|t2;
                // strict: forbid non-characters like U+fffe
                if(strict<=0 || !U_IS_UNICODE_NONCHAR(c)) {
                    *pi=i;
                    return c;
                }
            }
        } else {
            // strict=-2 -> lenient: allow surrogates
            uint8_t t1=s[i]-0x80, t2;
            if(t1<=0x3f && (c>0 || t1>=0x20) &&
                    ++i!=length && (t2=s[i]-0x80)<=0x3f) {
                *pi=i+1;
                return (c<<12)|(t1<<6)|t2;
            }
        }
    } else if(c>=0xc2) {
        uint8_t t1=s[i]-0x80;
        if(t1<=0x3f) {
            *pi=i+1;
            return ((c-0xc0)<<6)|t1;
        }
    }  // else 0x80<=c<0xc2 is not a lead byte

    /* error handling */
    c=errorValue(i-*pi, strict);
    *pi=i;
    return c;
}